

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

bool __thiscall Js::RecyclableObjectDisplay::IsLiteralProperty(RecyclableObjectDisplay *this)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  undefined4 *puVar4;
  ThreadContext *this_00;
  PropertyRecord *this_01;
  char16 *pcVar5;
  CharClassifier *this_02;
  char16 *psz;
  OLECHAR *pOVar6;
  WCHAR *endOfIdentifier;
  WCHAR *startOfPropertyName;
  PropertyRecord *propertyRecord;
  RecyclableObjectDisplay *this_local;
  
  if (this->scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x769,"(this->scriptContext)","this->scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->propertyId == -1) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = ScriptContext::GetThreadContext(this->scriptContext);
    this_01 = ThreadContext::GetPropertyName(this_00,this->propertyId);
    pcVar5 = PropertyRecord::GetBuffer(this_01);
    this_02 = ScriptContext::GetCharClassifier(this->scriptContext);
    psz = PropertyRecord::GetBuffer(this_01);
    pOVar6 = CharClassifier::SkipIdentifier(this_02,psz);
    cVar3 = PropertyRecord::GetLength(this_01);
    this_local._7_1_ = (charcount_t)((long)pOVar6 - (long)pcVar5 >> 1) == cVar3;
  }
  return this_local._7_1_;
}

Assistant:

bool RecyclableObjectDisplay::IsLiteralProperty() const
    {
        Assert(this->scriptContext);

        if (this->propertyId != Constants::NoProperty)
        {
            Js::PropertyRecord const * propertyRecord = this->scriptContext->GetThreadContext()->GetPropertyName(this->propertyId);
            const WCHAR* startOfPropertyName = propertyRecord->GetBuffer();
            const WCHAR* endOfIdentifier = this->scriptContext->GetCharClassifier()->SkipIdentifier((LPCOLESTR)propertyRecord->GetBuffer());
            return (charcount_t)(endOfIdentifier - startOfPropertyName) == propertyRecord->GetLength();
        }
        else
        {
            return true;
        }
    }